

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O1

void EVdfg_add_act_to_queue(EVdfg_configuration state,EVdfg_config_action act)

{
  int iVar1;
  undefined8 uVar2;
  _EVdfg_config_action *p_Var3;
  _EVdfg_config_action *p_Var4;
  
  uVar2 = act._0_8_;
  if (state->pending_action_queue == (_EVdfg_config_action *)0x0) {
    state->pending_action_count = 0;
    p_Var4 = (_EVdfg_config_action *)INT_CMmalloc(0x20);
    state->pending_action_queue = p_Var4;
    iVar1 = state->pending_action_count;
    state->pending_action_count = iVar1 + 1;
    p_Var3 = p_Var4 + iVar1;
    p_Var3->type = (int)uVar2;
    p_Var3->stone_id = (int)((ulong)uVar2 >> 0x20);
    p_Var3->node_for_action = act.node_for_action;
    *(undefined4 *)&p_Var3->field_0xc = act._12_4_;
    p_Var4[iVar1].u.create.action = (char *)act.u.create.action;
    *(undefined8 *)((long)&p_Var4[iVar1].u + 8) = act.u._8_8_;
  }
  else {
    p_Var3 = (_EVdfg_config_action *)
             INT_CMrealloc(state->pending_action_queue,
                           (long)state->pending_action_count * 0x20 + 0x20);
    state->pending_action_queue = p_Var3;
    if (act.type == ACT_create_bridge) {
      memmove(p_Var3 + 1,p_Var3,(long)state->pending_action_count << 5);
      p_Var3 = state->pending_action_queue;
      p_Var3->type = (int)uVar2;
      p_Var3->stone_id = (int)((ulong)uVar2 >> 0x20);
      p_Var3->node_for_action = act.node_for_action;
      *(undefined4 *)&p_Var3->field_0xc = act._12_4_;
      (p_Var3->u).create.action = (char *)act.u.create.action;
      *(undefined8 *)((long)&p_Var3->u + 8) = act.u._8_8_;
      state->pending_action_count = state->pending_action_count + 1;
    }
    else {
      iVar1 = state->pending_action_count;
      state->pending_action_count = iVar1 + 1;
      p_Var3[iVar1].u.create.action = (char *)act.u.create.action;
      *(undefined8 *)((long)&p_Var3[iVar1].u + 8) = act.u._8_8_;
      p_Var3 = p_Var3 + iVar1;
      p_Var3->type = (int)uVar2;
      p_Var3->stone_id = (int)((ulong)uVar2 >> 0x20);
      p_Var3->node_for_action = act.node_for_action;
      *(undefined4 *)&p_Var3->field_0xc = act._12_4_;
    }
  }
  return;
}

Assistant:

static void
EVdfg_add_act_to_queue(EVdfg_configuration state, EVdfg_config_action act)
{
    if (state->pending_action_queue == NULL) {
	state->pending_action_count = 0;
	state->pending_action_queue = malloc(sizeof(state->pending_action_queue[0]));
	state->pending_action_queue[state->pending_action_count++] = act;
	return;
    }
    state->pending_action_queue = realloc(state->pending_action_queue, 
					  sizeof(state->pending_action_queue[0]) * (state->pending_action_count+1));
    if (act.type == ACT_create_bridge) {
	/* insert at beginning */
	memmove(&state->pending_action_queue[1], state->pending_action_queue, 
		sizeof(state->pending_action_queue[0]) * state->pending_action_count);
	state->pending_action_queue[0] = act;
	state->pending_action_count++;
    } else {
	state->pending_action_queue[state->pending_action_count++] = act;
    }
}